

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

bool __thiscall
Parsing::Parser::checkHeaders
          (Parser *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *v)

{
  pointer pbVar1;
  bool bVar2;
  bool bVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  allocator<char> local_a9;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  file;
  File f;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&file,"rsrc/header.txt",&local_a9);
  File::File(&f,(string *)&file);
  std::__cxx11::string::~string((string *)&file);
  bVar2 = File::isFile(&f);
  if (!bVar2) {
    bVar2 = false;
    goto LAB_001067d9;
  }
  File::getContent_abi_cxx11_(&file,&f);
  if ((ulong)((long)file.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
             (long)file.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start) <
      (ulong)((long)(v->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
             (long)(v->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start)) {
    uVar7 = 0xffffffffffffffff;
    lVar4 = 0;
    do {
      uVar6 = (long)file.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)file.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 5;
      pbVar1 = (v->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      uVar7 = uVar7 + 1;
      if (uVar6 <= uVar7) {
        lVar4 = (long)(v->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1;
        lVar5 = uVar6 * 0x20;
        goto LAB_0010680b;
      }
      bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              ((long)&((file.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                      _M_p + lVar4),
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              ((long)&(pbVar1->_M_dataplus)._M_p + lVar4));
      lVar4 = lVar4 + 0x20;
    } while (!bVar2);
  }
  bVar2 = false;
  goto LAB_001067cb;
  while (bVar3 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)((long)&file.
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start[-1].
                                            _M_dataplus._M_p + lVar5),
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)((long)&(v->
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            )._M_impl.super__Vector_impl_data._M_start[-1].
                                            _M_dataplus._M_p + lVar4)), lVar4 = lVar4 + -0x20,
        lVar5 = lVar5 + -0x20, !bVar3) {
LAB_0010680b:
    uVar6 = uVar6 - 1;
    bVar2 = uVar6 == 0;
    if (bVar2) break;
  }
LAB_001067cb:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&file);
LAB_001067d9:
  File::~File(&f);
  return bVar2;
}

Assistant:

bool Parser::checkHeaders(const std::vector<std::string> &v)
    {
        Parsing::File f("rsrc/header.txt");

        if (!f.isFile())
            return false;

        std::vector<std::string> file = f.getContent();

        if (file.size() >= v.size())
            return false;

        for (size_t it = 0; it < file.size(); it++)
            if (file[it] != v[it])
                return false;

        size_t f_it = file.size() - 1;
        size_t v_it = v.size() - 1;

        while (f_it > 0)
            if (file[f_it--] != v[v_it--])
                return false;
        return true;
    }